

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_cfd_confidentialtx_context.cpp
# Opt level: O0

void __thiscall
ConfidentialTransactionContext_SetAssetReissuanceTest1_Test::TestBody
          (ConfidentialTransactionContext_SetAssetReissuanceTest1_Test *this)

{
  bool bVar1;
  char *pcVar2;
  char *rhs;
  undefined1 extraout_DL;
  AssertionResult gtest_ar;
  IssuanceOutputParameter issue_output;
  IssuanceParameter param;
  BlindFactor entropy;
  BlindFactor blind_factor;
  ElementsConfidentialAddress address;
  Amount amount;
  Txid txid;
  ConfidentialTransactionContext tx;
  ConfidentialTransactionContext expect_tx;
  ConfidentialTransactionContext tx_base;
  IssuanceParameter *pIVar3;
  IssuanceOutputParameter *in_stack_fffffffffffff540;
  undefined6 in_stack_fffffffffffff560;
  undefined1 in_stack_fffffffffffff566;
  undefined1 in_stack_fffffffffffff567;
  AssertHelper local_a58;
  Message local_a50;
  string local_a48 [32];
  string local_a28 [32];
  AssertionResult local_a08;
  AssertHelper local_9f8;
  Message local_9f0 [2];
  undefined1 local_9e0 [152];
  BlindFactor local_948 [11];
  ElementsConfidentialAddress local_7d0 [488];
  _func_int **local_5e8;
  undefined1 local_5e0;
  allocator local_559;
  string local_558 [32];
  undefined1 local_538 [40];
  string local_510 [32];
  BlindFactor local_4f0;
  allocator local_4c9;
  string local_4c8 [32];
  ElementsConfidentialAddress local_4a8 [432];
  _func_int **local_2f8;
  undefined1 local_2f0;
  undefined1 local_2e8 [24];
  string local_2d0 [32];
  Txid local_2b0;
  ConfidentialTransactionContext local_290 [191];
  allocator local_1d1;
  string local_1d0 [32];
  ConfidentialTransactionContext local_1b0 [207];
  allocator local_e1;
  string local_e0 [32];
  ConfidentialTransactionContext local_c0 [192];
  
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            (local_e0,
             "0200000000025e67a3542db02871642bdf0923d33ac5bd1105f3421520297f01617c6323918d0000000000ffffffff5e67a3542db02871642bdf0923d33ac5bd1105f3421520297f01617c6323918d0200000000ffffffff03017981c1f171d7973a1fd922652f559f47d6d1506a4be2394b27a54951957f6c18010000000029b9270003f4f10478f5fae2c77c44fdb2a304109a9ae8ba7cab1c125deba9e618ca737e851976a91484c2ef274919355bb532a5bbdbfa95490c5d749388ac017981c1f171d7973a1fd922652f559f47d6d1506a4be2394b27a54951957f6c1801000000003b97049c03b69e5ef61aef08565404bc3c98d6e4dfd1e02eb94138617d9b3eb12ec790885317a91401e940d9dcd77a5043356941641aa2fd6ec6a68887017981c1f171d7973a1fd922652f559f47d6d1506a4be2394b27a54951957f6c18010000000000002710000000000000"
             ,&local_e1);
  cfd::ConfidentialTransactionContext::ConfidentialTransactionContext(local_c0,local_e0);
  std::__cxx11::string::~string(local_e0);
  std::allocator<char>::~allocator((allocator<char> *)&local_e1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            (local_1d0,
             "0200000000025e67a3542db02871642bdf0923d33ac5bd1105f3421520297f01617c6323918d0000000000ffffffff5e67a3542db02871642bdf0923d33ac5bd1105f3421520297f01617c6323918d0200008000ffffffffcf9a1b9aeb2de6a7b7c3177433dced0951fd728dffbe8c935ccb80698f2e08c80683fe0819a4f9770c8a7cd5824e82975c825e017aff8ba0d6a5eb4959cf9c6f010000000029b927000004017981c1f171d7973a1fd922652f559f47d6d1506a4be2394b27a54951957f6c18010000000029b9270003f4f10478f5fae2c77c44fdb2a304109a9ae8ba7cab1c125deba9e618ca737e851976a91484c2ef274919355bb532a5bbdbfa95490c5d749388ac017981c1f171d7973a1fd922652f559f47d6d1506a4be2394b27a54951957f6c1801000000003b97049c03b69e5ef61aef08565404bc3c98d6e4dfd1e02eb94138617d9b3eb12ec790885317a91401e940d9dcd77a5043356941641aa2fd6ec6a68887017981c1f171d7973a1fd922652f559f47d6d1506a4be2394b27a54951957f6c18010000000000002710000001cdb0ed311810e61036ac9255674101497850f5eee5e4320be07479c05473cbac010000000029b9270003f234757d0e00e6a7a7a3b4b2b31fb0328d7b9f755cd1093d9f61892fef3116871976a91435ef6d4b59f26089dfe2abca21408e15fee42a3388ac00000000"
             ,&local_1d1);
  cfd::ConfidentialTransactionContext::ConfidentialTransactionContext(local_1b0,local_1d0);
  std::__cxx11::string::~string(local_1d0);
  std::allocator<char>::~allocator((allocator<char> *)&local_1d1);
  cfd::ConfidentialTransactionContext::ConfidentialTransactionContext(local_290,local_c0);
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            (local_2d0,"8d9123637c61017f29201542f30511bdc53ad32309df2b647128b02d54a3675e",
             (allocator *)(local_2e8 + 0x17));
  cfd::core::Txid::Txid(&local_2b0,local_2d0);
  std::__cxx11::string::~string(local_2d0);
  std::allocator<char>::~allocator((allocator<char> *)(local_2e8 + 0x17));
  local_2f8 = (_func_int **)cfd::core::Amount::CreateByCoinAmount(7.0);
  local_2f0 = extraout_DL;
  local_2e8._0_8_ = local_2f8;
  local_2e8[8] = extraout_DL;
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            (local_4c8,
             "CTEyBCf1WzQDpbv6sXLTnFaknGK2UJMHqjyGJjQGq9NEytBR2JLHR9cHJSk4MbLVcKQYWsWERUEYN6R3",
             &local_4c9);
  cfd::core::ElementsConfidentialAddress::ElementsConfidentialAddress(local_4a8,local_4c8);
  std::__cxx11::string::~string(local_4c8);
  std::allocator<char>::~allocator((allocator<char> *)&local_4c9);
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            (local_510,"c8082e8f6980cb5c938cbeff8d72fd5109eddc337417c3b7a7e62deb9a1b9acf",
             (allocator *)(local_538 + 0x27));
  cfd::core::BlindFactor::BlindFactor(&local_4f0,local_510);
  std::__cxx11::string::~string(local_510);
  std::allocator<char>::~allocator((allocator<char> *)(local_538 + 0x27));
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            (local_558,"6f9ccf5949eba5d6a08bff7a015e825c97824e82d57c8a0c77f9a41908fe8306",&local_559
            );
  cfd::core::BlindFactor::BlindFactor((BlindFactor *)local_538,local_558);
  std::__cxx11::string::~string(local_558);
  std::allocator<char>::~allocator((allocator<char> *)&local_559);
  cfd::core::IssuanceParameter::IssuanceParameter
            ((IssuanceParameter *)
             CONCAT17(in_stack_fffffffffffff567,
                      CONCAT16(in_stack_fffffffffffff566,in_stack_fffffffffffff560)));
  cfd::IssuanceOutputParameter::IssuanceOutputParameter
            ((IssuanceOutputParameter *)
             CONCAT17(in_stack_fffffffffffff567,
                      CONCAT16(in_stack_fffffffffffff566,in_stack_fffffffffffff560)));
  cfd::core::ElementsConfidentialAddress::operator=(local_7d0,local_4a8);
  local_5e0 = local_2e8[8];
  local_5e8 = (_func_int **)local_2e8._0_8_;
  bVar1 = testing::internal::AlwaysTrue();
  if (bVar1) {
    bVar1 = testing::internal::AlwaysTrue();
    if (bVar1) {
      cfd::core::OutPoint::OutPoint((OutPoint *)local_9e0,&local_2b0,2);
      pIVar3 = (IssuanceParameter *)local_538;
      cfd::ConfidentialTransactionContext::SetAssetReissuance
                ((OutPoint *)(local_9e0 + 0x28),(Amount *)local_290,
                 (IssuanceOutputParameter *)local_9e0,(BlindFactor *)local_2e8,local_948);
      cfd::core::IssuanceParameter::operator=((IssuanceParameter *)in_stack_fffffffffffff540,pIVar3)
      ;
      cfd::core::IssuanceParameter::~IssuanceParameter
                ((IssuanceParameter *)in_stack_fffffffffffff540);
      cfd::core::OutPoint::~OutPoint((OutPoint *)0x1d819d);
    }
  }
  else {
    testing::Message::Message(local_9f0);
    testing::internal::AssertHelper::AssertHelper
              (&local_9f8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/external/cfd/test/test_cfd_confidentialtx_context.cpp"
               ,0xf2,
               "Expected: (param = tx.SetAssetReissuance(OutPoint(txid, 2), amount, issue_output, blind_factor, entropy)) doesn\'t throw an exception.\n  Actual: it throws."
              );
    testing::internal::AssertHelper::operator=(&local_9f8,local_9f0);
    testing::internal::AssertHelper::~AssertHelper(&local_9f8);
    testing::Message::~Message((Message *)0x1d84c0);
  }
  cfd::core::AbstractTransaction::GetHex_abi_cxx11_();
  pcVar2 = (char *)std::__cxx11::string::c_str();
  cfd::core::AbstractTransaction::GetHex_abi_cxx11_();
  rhs = (char *)std::__cxx11::string::c_str();
  testing::internal::CmpHelperSTREQ
            ((internal *)&local_a08,"tx.GetHex().c_str()","expect_tx.GetHex().c_str()",pcVar2,rhs);
  std::__cxx11::string::~string(local_a48);
  std::__cxx11::string::~string(local_a28);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_a08);
  if (!bVar1) {
    testing::Message::Message(&local_a50);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)0x1d8634);
    testing::internal::AssertHelper::AssertHelper
              (&local_a58,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/external/cfd/test/test_cfd_confidentialtx_context.cpp"
               ,0xf3,pcVar2);
    testing::internal::AssertHelper::operator=(&local_a58,&local_a50);
    testing::internal::AssertHelper::~AssertHelper(&local_a58);
    testing::Message::~Message((Message *)0x1d8682);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x1d86d4);
  cfd::IssuanceOutputParameter::~IssuanceOutputParameter(in_stack_fffffffffffff540);
  cfd::core::IssuanceParameter::~IssuanceParameter((IssuanceParameter *)in_stack_fffffffffffff540);
  cfd::core::BlindFactor::~BlindFactor((BlindFactor *)0x1d86fb);
  cfd::core::BlindFactor::~BlindFactor((BlindFactor *)0x1d8708);
  cfd::core::ElementsConfidentialAddress::~ElementsConfidentialAddress
            ((ElementsConfidentialAddress *)in_stack_fffffffffffff540);
  cfd::core::Txid::~Txid((Txid *)0x1d8722);
  cfd::ConfidentialTransactionContext::~ConfidentialTransactionContext
            ((ConfidentialTransactionContext *)in_stack_fffffffffffff540);
  cfd::ConfidentialTransactionContext::~ConfidentialTransactionContext
            ((ConfidentialTransactionContext *)in_stack_fffffffffffff540);
  cfd::ConfidentialTransactionContext::~ConfidentialTransactionContext
            ((ConfidentialTransactionContext *)in_stack_fffffffffffff540);
  return;
}

Assistant:

TEST(ConfidentialTransactionContext, SetAssetReissuanceTest1)
{
    ConfidentialTransactionContext tx_base(
        "0200000000025e67a3542db02871642bdf0923d33ac5bd1105f3421520297f01617c6323918d0000000000ffffffff5e67a3542db02871642bdf0923d33ac5bd1105f3421520297f01617c6323918d0200000000ffffffff03017981c1f171d7973a1fd922652f559f47d6d1506a4be2394b27a54951957f6c18010000000029b9270003f4f10478f5fae2c77c44fdb2a304109a9ae8ba7cab1c125deba9e618ca737e851976a91484c2ef274919355bb532a5bbdbfa95490c5d749388ac017981c1f171d7973a1fd922652f559f47d6d1506a4be2394b27a54951957f6c1801000000003b97049c03b69e5ef61aef08565404bc3c98d6e4dfd1e02eb94138617d9b3eb12ec790885317a91401e940d9dcd77a5043356941641aa2fd6ec6a68887017981c1f171d7973a1fd922652f559f47d6d1506a4be2394b27a54951957f6c18010000000000002710000000000000");
    ConfidentialTransactionContext expect_tx(
        "0200000000025e67a3542db02871642bdf0923d33ac5bd1105f3421520297f01617c6323918d0000000000ffffffff5e67a3542db02871642bdf0923d33ac5bd1105f3421520297f01617c6323918d0200008000ffffffffcf9a1b9aeb2de6a7b7c3177433dced0951fd728dffbe8c935ccb80698f2e08c80683fe0819a4f9770c8a7cd5824e82975c825e017aff8ba0d6a5eb4959cf9c6f010000000029b927000004017981c1f171d7973a1fd922652f559f47d6d1506a4be2394b27a54951957f6c18010000000029b9270003f4f10478f5fae2c77c44fdb2a304109a9ae8ba7cab1c125deba9e618ca737e851976a91484c2ef274919355bb532a5bbdbfa95490c5d749388ac017981c1f171d7973a1fd922652f559f47d6d1506a4be2394b27a54951957f6c1801000000003b97049c03b69e5ef61aef08565404bc3c98d6e4dfd1e02eb94138617d9b3eb12ec790885317a91401e940d9dcd77a5043356941641aa2fd6ec6a68887017981c1f171d7973a1fd922652f559f47d6d1506a4be2394b27a54951957f6c18010000000000002710000001cdb0ed311810e61036ac9255674101497850f5eee5e4320be07479c05473cbac010000000029b9270003f234757d0e00e6a7a7a3b4b2b31fb0328d7b9f755cd1093d9f61892fef3116871976a91435ef6d4b59f26089dfe2abca21408e15fee42a3388ac00000000");

    // not blind
    ConfidentialTransactionContext tx(tx_base);
    Txid txid("8d9123637c61017f29201542f30511bdc53ad32309df2b647128b02d54a3675e");
    Amount amount = Amount::CreateByCoinAmount(7.0);
    ElementsConfidentialAddress address("CTEyBCf1WzQDpbv6sXLTnFaknGK2UJMHqjyGJjQGq9NEytBR2JLHR9cHJSk4MbLVcKQYWsWERUEYN6R3");
    BlindFactor blind_factor("c8082e8f6980cb5c938cbeff8d72fd5109eddc337417c3b7a7e62deb9a1b9acf");
    BlindFactor entropy("6f9ccf5949eba5d6a08bff7a015e825c97824e82d57c8a0c77f9a41908fe8306");

    IssuanceParameter param;
    IssuanceOutputParameter issue_output;
    issue_output.confidential_address = address;
    issue_output.amount = amount;
    EXPECT_NO_THROW(
        (param = tx.SetAssetReissuance(OutPoint(txid, 2), amount,
                                       issue_output, blind_factor, entropy)));
    EXPECT_STREQ(tx.GetHex().c_str(), expect_tx.GetHex().c_str());
}